

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::SerializeInternal
               (uint8 *base,FieldMetadata *field_metadata_table,int32 num_fields,
               CodedOutputStream *output)

{
  float fVar1;
  uint uVar2;
  CodedOutputStream *output_00;
  double *field;
  ulong uVar3;
  FieldMetadata *field_metadata;
  uint32 *has_bits_array;
  uint local_3c;
  CodedOutputStream *local_38;
  
  if (0 < num_fields) {
    uVar3 = (ulong)(uint)num_fields;
    local_38 = output;
    do {
      output_00 = local_38;
      uVar2 = field_metadata_table->type;
      if (0x69 < uVar2) {
switchD_00233725_caseD_12:
        SerializeNotImplemented(uVar2);
        goto LAB_0023400e;
      }
      field = (double *)(base + field_metadata_table->offset);
      switch(uVar2) {
      case 0:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_00233fd6:
          SingularFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>
                    (field,field_metadata_table,local_38);
        }
        break;
      case 1:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_00233eda:
          SingularFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>
                    (field,field_metadata_table,local_38);
        }
        break;
      case 2:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_00233b82:
          uVar2 = field_metadata_table->tag;
LAB_00233b86:
          local_3c = uVar2;
          PrimitiveTypeHelper<13>::Serialize(&local_3c,local_38);
          PrimitiveTypeHelper<3>::Serialize(field,local_38);
        }
        break;
      case 3:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_00233c29:
          uVar2 = field_metadata_table->tag;
LAB_00233c2d:
          local_3c = uVar2;
          PrimitiveTypeHelper<13>::Serialize(&local_3c,local_38);
          PrimitiveTypeHelper<4>::Serialize(field,local_38);
        }
        break;
      case 4:
      case 0xd:
        fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                        (field_metadata_table->has_offset & 0x1f) & 1);
        goto joined_r0x00233784;
      case 5:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_00233d4c:
          SingularFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>
                    (field,field_metadata_table,local_38);
        }
        break;
      case 6:
        fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                        (field_metadata_table->has_offset & 0x1f) & 1);
        goto joined_r0x00233ae9;
      case 7:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_00233b0a:
          SingularFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>
                    (field,field_metadata_table,local_38);
        }
        break;
      case 8:
      case 0xb:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_002337eb:
          uVar2 = field_metadata_table->tag;
LAB_002337ef:
          local_3c = uVar2;
          PrimitiveTypeHelper<13>::Serialize(&local_3c,local_38);
          field = (double *)*field;
          output_00 = local_38;
LAB_00233d86:
          PrimitiveTypeHelper<9>::Serialize(field,output_00);
        }
        break;
      case 9:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_00233b58:
          SingularFieldHelper<10>::Serialize<google::protobuf::io::CodedOutputStream>
                    (field,field_metadata_table,local_38);
        }
        break;
      case 10:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_00233bfe:
          SingularFieldHelper<11>::Serialize<google::protobuf::io::CodedOutputStream>
                    (field,field_metadata_table,local_38);
        }
        break;
      case 0xc:
        fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                        (field_metadata_table->has_offset & 0x1f) & 1);
        goto joined_r0x00233c17;
      case 0xe:
        fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                        (field_metadata_table->has_offset & 0x1f) & 1);
        goto joined_r0x00233ac9;
      case 0xf:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_00233ff8:
          SingularFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>
                    (field,field_metadata_table,local_38);
        }
        break;
      case 0x10:
        fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                        (field_metadata_table->has_offset & 0x1f) & 1);
        goto joined_r0x00233f1b;
      case 0x11:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_00233e0f:
          uVar2 = field_metadata_table->tag;
LAB_00233e13:
          local_3c = uVar2;
          PrimitiveTypeHelper<13>::Serialize(&local_3c,local_38);
          PrimitiveTypeHelper<18>::Serialize(field,local_38);
        }
        break;
      default:
        goto switchD_00233725_caseD_12;
      case 0x14:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_00233d6c:
          local_3c = field_metadata_table->tag;
          PrimitiveTypeHelper<13>::Serialize(&local_3c,local_38);
          output_00 = local_38;
          goto LAB_00233d86;
        }
        break;
      case 0x15:
        if ((*field != 0.0) || (NAN(*field))) goto LAB_00233fd6;
        break;
      case 0x16:
        if ((*(float *)field != 0.0) || (NAN(*(float *)field))) goto LAB_00233eda;
        break;
      case 0x17:
        if (*field != 0.0) goto LAB_00233b82;
        break;
      case 0x18:
        if (*field != 0.0) goto LAB_00233c29;
        break;
      case 0x19:
      case 0x22:
        fVar1 = *(float *)field;
joined_r0x00233784:
        if (fVar1 != 0.0) {
          uVar2 = field_metadata_table->tag;
LAB_002337a5:
          local_3c = uVar2;
          PrimitiveTypeHelper<13>::Serialize(&local_3c,local_38);
          PrimitiveTypeHelper<5>::Serialize(field,local_38);
        }
        break;
      case 0x1a:
        if (*field != 0.0) goto LAB_00233d4c;
        break;
      case 0x1b:
        fVar1 = *(float *)field;
joined_r0x00233ae9:
        if (fVar1 != 0.0) {
LAB_00233d2d:
          SingularFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>
                    (field,field_metadata_table,local_38);
        }
        break;
      case 0x1c:
        if (*(char *)field != '\0') goto LAB_00233b0a;
        break;
      case 0x1d:
      case 0x20:
        if (*(long *)((long)*field + 8) != 0) goto LAB_002337eb;
        break;
      case 0x1e:
        if (*field != 0.0) goto LAB_00233b58;
        break;
      case 0x1f:
        if (*field != 0.0) goto LAB_00233bfe;
        break;
      case 0x21:
        fVar1 = *(float *)field;
joined_r0x00233c17:
        if (fVar1 != 0.0) {
          uVar2 = field_metadata_table->tag;
LAB_00233c67:
          local_3c = uVar2;
          PrimitiveTypeHelper<13>::Serialize(&local_3c,local_38);
          PrimitiveTypeHelper<13>::Serialize(field,local_38);
        }
        break;
      case 0x23:
        fVar1 = *(float *)field;
joined_r0x00233ac9:
        if (fVar1 != 0.0) {
LAB_00233dba:
          SingularFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>
                    (field,field_metadata_table,local_38);
        }
        break;
      case 0x24:
        if (*field != 0.0) goto LAB_00233ff8;
        break;
      case 0x25:
        fVar1 = *(float *)field;
joined_r0x00233f1b:
        if (fVar1 != 0.0) {
          uVar2 = field_metadata_table->tag;
LAB_00233f25:
          local_3c = uVar2;
          PrimitiveTypeHelper<13>::Serialize(&local_3c,local_38);
          PrimitiveTypeHelper<17>::Serialize(field,local_38);
        }
        break;
      case 0x26:
        if (*field != 0.0) goto LAB_00233e0f;
        break;
      case 0x29:
        if (field[1] != 0.0) goto LAB_00233d6c;
        break;
      case 0x2a:
        RepeatedFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x2b:
        RepeatedFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x2c:
        RepeatedFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x2d:
        RepeatedFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x2e:
        RepeatedFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x2f:
        RepeatedFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x30:
        RepeatedFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x31:
        RepeatedFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x32:
      case 0x35:
      case 0x3e:
        RepeatedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x33:
        RepeatedFieldHelper<10>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x34:
        RepeatedFieldHelper<11>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x36:
        RepeatedFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x37:
        RepeatedFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x38:
        RepeatedFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x39:
        RepeatedFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x3a:
        RepeatedFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x3b:
        RepeatedFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x3f:
        PackedFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x40:
        PackedFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x41:
        PackedFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x42:
        PackedFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x43:
        PackedFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x44:
        PackedFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x45:
        PackedFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x46:
        PackedFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x47:
      case 0x48:
      case 0x49:
      case 0x4a:
      case 0x53:
        PackedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x4b:
        PackedFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x4c:
        PackedFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x4d:
        PackedFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x4e:
        PackedFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x4f:
        PackedFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x50:
        PackedFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,local_38);
        break;
      case 0x54:
        if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
        goto LAB_00233fd6;
        break;
      case 0x55:
        if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
        goto LAB_00233eda;
        break;
      case 0x56:
        uVar2 = field_metadata_table->tag;
        if (*(uint *)(base + field_metadata_table->has_offset) == uVar2 >> 3) goto LAB_00233b86;
        break;
      case 0x57:
        uVar2 = field_metadata_table->tag;
        if (*(uint *)(base + field_metadata_table->has_offset) == uVar2 >> 3) goto LAB_00233c2d;
        break;
      case 0x58:
      case 0x61:
        uVar2 = field_metadata_table->tag;
        if (*(uint *)(base + field_metadata_table->has_offset) != uVar2 >> 3) break;
        goto LAB_002337a5;
      case 0x59:
        if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
        goto LAB_00233d4c;
        break;
      case 0x5a:
        if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
        break;
        goto LAB_00233d2d;
      case 0x5b:
        if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
        goto LAB_00233b0a;
        break;
      case 0x5c:
      case 0x5f:
        uVar2 = field_metadata_table->tag;
        if (*(uint *)(base + field_metadata_table->has_offset) == uVar2 >> 3) goto LAB_002337ef;
        break;
      case 0x5d:
        if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
        goto LAB_00233b58;
        break;
      case 0x5e:
        if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3) {
          local_3c = field_metadata_table->tag;
          PrimitiveTypeHelper<13>::Serialize(&local_3c,local_38);
          SerializeMessageTo<google::protobuf::io::CodedOutputStream>
                    ((MessageLite *)*field,field_metadata_table->ptr,local_38);
        }
        break;
      case 0x60:
        uVar2 = field_metadata_table->tag;
        if (*(uint *)(base + field_metadata_table->has_offset) != uVar2 >> 3) break;
        goto LAB_00233c67;
      case 0x62:
        if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
        break;
        goto LAB_00233dba;
      case 99:
        if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
        goto LAB_00233ff8;
        break;
      case 100:
        uVar2 = field_metadata_table->tag;
        if (*(uint *)(base + field_metadata_table->has_offset) != uVar2 >> 3) break;
        goto LAB_00233f25;
      case 0x65:
        uVar2 = field_metadata_table->tag;
        if (*(uint *)(base + field_metadata_table->has_offset) == uVar2 >> 3) goto LAB_00233e13;
        break;
      case 0x68:
        if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3) {
          field = (double *)*field;
          local_3c = field_metadata_table->tag;
          PrimitiveTypeHelper<13>::Serialize(&local_3c,local_38);
          goto LAB_00233d86;
        }
        break;
      case 0x69:
        (*(code *)field_metadata_table->ptr)
                  (base,(ulong)field_metadata_table->offset,field_metadata_table->tag,
                   field_metadata_table->has_offset,local_38);
      }
LAB_0023400e:
      field_metadata_table = field_metadata_table + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

void SerializeInternal(const uint8* base,
                       const FieldMetadata* field_metadata_table,
                       int32 num_fields, io::CodedOutputStream* output) {
  SpecialSerializer func = nullptr;
  for (int i = 0; i < num_fields; i++) {
    const FieldMetadata& field_metadata = field_metadata_table[i];
    const uint8* ptr = base + field_metadata.offset;
    switch (field_metadata.type) {
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_DOUBLE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FLOAT);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BOOL);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_STRING);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_GROUP);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_MESSAGE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BYTES);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_ENUM);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT64);
      SERIALIZERS_FOR_TYPE(FieldMetadata::kInlinedType);

      // Special cases
      case FieldMetadata::kSpecial:
        func = reinterpret_cast<SpecialSerializer>(
            const_cast<void*>(field_metadata.ptr));
        func(base, field_metadata.offset, field_metadata.tag,
             field_metadata.has_offset, output);
        break;
      default:
        // __builtin_unreachable()
        SerializeNotImplemented(field_metadata.type);
    }
  }
}